

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O3

int SSL_get_verify_callback(int param_1,X509_STORE_CTX *param_2)

{
  undefined4 in_register_0000003c;
  long lVar1;
  
  lVar1 = CONCAT44(in_register_0000003c,param_1);
  if ((lVar1 != 0) &&
     (*(undefined1 **)(*(long *)(lVar1 + 0x68) + 0x10) != bssl::ssl_crypto_x509_method)) {
    __assert_fail("ssl == NULL || ssl->ctx->x509_method == &ssl_crypto_x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x26,"void bssl::check_ssl_x509_method(const SSL *)");
  }
  if (*(long *)(lVar1 + 8) != 0) {
    return (int)*(undefined8 *)(*(long *)(lVar1 + 8) + 0x28);
  }
  __assert_fail("ssl->config",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                ,0x1da,"int (*SSL_get_verify_callback(const SSL *))(int, X509_STORE_CTX *)");
}

Assistant:

int (*SSL_get_verify_callback(const SSL *ssl))(int, X509_STORE_CTX *) {
  check_ssl_x509_method(ssl);
  if (!ssl->config) {
    assert(ssl->config);
    return 0;
  }
  return ssl->config->verify_callback;
}